

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# keygen.c
# Opt level: O3

int ulp_generate_parameters(size_t n,size_t l,uint64_t *sk,uint64_t *se,uint64_t *q)

{
  float fVar1;
  float fVar2;
  int iVar3;
  uint uVar4;
  long lVar5;
  ulong uVar6;
  uint64_t uVar7;
  double dVar8;
  undefined1 auVar9 [16];
  double dVar10;
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  
  uVar4 = 0xfffffffe;
  if ((q != (uint64_t *)0x0 &&
       ((se != (uint64_t *)0x0 && sk != (uint64_t *)0x0) && (l != 0 && n != 0))) &&
     (uVar4 = 0xfffffff8, (n & 7) == 0)) {
    auVar9._8_4_ = (int)(n >> 0x20);
    auVar9._0_8_ = n;
    auVar9._12_4_ = 0x45300000;
    dVar10 = (auVar9._8_8_ - 1.9342813113834067e+25) +
             ((double)CONCAT44(0x43300000,(int)n) - 4503599627370496.0);
    dVar8 = pow(dVar10 * 35.184077269267,1.2857142857142858);
    dVar8 = ceil(dVar8);
    *sk = (long)(dVar8 - 9.223372036854776e+18) & (long)dVar8 >> 0x3f | (long)dVar8;
    lVar5 = n * 2 + l;
    auVar11._8_4_ = (int)((ulong)lVar5 >> 0x20);
    auVar11._0_8_ = lVar5;
    auVar11._12_4_ = 0x45300000;
    auVar12._8_4_ = (int)(l >> 0x20);
    auVar12._0_8_ = l;
    auVar12._12_4_ = 0x45300000;
    dVar8 = pow(((auVar11._8_8_ - 1.9342813113834067e+25) +
                ((double)CONCAT44(0x43300000,(int)lVar5) - 4503599627370496.0)) * 17.5920386346335,
                (((auVar12._8_8_ - 1.9342813113834067e+25) +
                 ((double)CONCAT44(0x43300000,(int)l) - 4503599627370496.0)) * 1.1428571428571428) /
                dVar10 + 1.2857142857142858);
    dVar8 = ceil(dVar8);
    uVar6 = (long)(dVar8 - 9.223372036854776e+18) & (long)dVar8 >> 0x3f | (long)dVar8;
    *se = uVar6;
    fVar1 = (float)(long)(uVar6 * 4) +
            *(float *)(&DAT_00102058 + (ulong)((long)(uVar6 * 4) < 0) * 4);
    fVar1 = fVar1 * fVar1;
    fVar2 = 0.0;
    if (9.223372e+18 <= fVar1) {
      fVar2 = 9.223372e+18;
    }
    uVar7 = max((ulong)(9.223372e+18 <= fVar1) << 0x3f ^ (long)ROUND(fVar1 - fVar2),
                n * uVar6 * *sk * 8 + uVar6 * 4 + 4);
    uVar6 = uVar7 | 1;
    *q = uVar6;
    while( true ) {
      iVar3 = is_prime(uVar6);
      if (iVar3 != 0) break;
      uVar6 = *q + 2;
      *q = uVar6;
    }
    uVar4 = (uint)((long)*q >> 0x3f) & 0xffffffc1;
  }
  return uVar4;
}

Assistant:

int ulp_generate_parameters(size_t n, size_t l, uint64_t* sk, uint64_t* se, uint64_t* q) {

    if(n == 0 || l == 0 || sk == NULL || se == NULL || q == NULL)
        return -2;

    if(n % 8 != 0)
        return -8;

    // compute parameters
    *sk = ceil(pow(2*C*n, 9.0/7.0));
    *se = ceil(pow(C*(2*n+l), 9.0/7.0 + 8.0/7.0 * (double)l/(double)n));
    *q = max(powl(4*(*se), 2), 8*n*(*se)*(*sk) + 4*(*se) + 4);
    // search next prime number
    if(*q % 2 == 0)
        (*q)++;
    while(!is_prime(*q))
        (*q)+=2;

    if(*q >= 0x8000000000000000) // 2^63
        return -63;

    return 0;

}